

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t pax_attribute_SCHILY_acl
                  (archive_read *a,tar *tar,archive_entry *entry,size_t value_length,wchar_t type)

{
  wchar_t wVar1;
  mode_t p;
  archive_string_conv *paVar2;
  char *text;
  archive_acl *acl;
  char *pcVar3;
  
  if (type == L'Ā') {
    pcVar3 = "SCHILY.acl.access";
  }
  else if (type == L'㰀') {
    pcVar3 = "SCHILY.acl.ace";
  }
  else {
    if (type != L'Ȁ') {
      archive_set_error(&a->archive,-1,"Unknown ACL type: %d",type);
      return L'\xffffffe2';
    }
    pcVar3 = "SCHILY.acl.default";
  }
  if (tar->sconv_acl == (archive_string_conv *)0x0) {
    paVar2 = archive_string_conversion_from_charset((archive_conflict *)a,"UTF-8",L'\x01');
    tar->sconv_acl = paVar2;
    if (paVar2 == (archive_string_conv *)0x0) {
      return L'\xffffffe2';
    }
  }
  if (0x20000 < value_length) {
    __archive_read_consume(a,value_length);
    archive_set_error(&a->archive,-1,"Unreasonably large ACL: %d > %d",value_length & 0xffffffff,
                      0x20000);
    return L'\xffffffec';
  }
  text = (char *)__archive_read_ahead(a,value_length,(ssize_t *)0x0);
  if (text == (char *)0x0) {
    archive_set_error(&a->archive,0x54,"Truncated tar archive detected while reading ACL data");
  }
  else {
    acl = archive_entry_acl(entry);
    wVar1 = archive_acl_from_text_nl(acl,text,value_length,type,tar->sconv_acl);
    __archive_read_consume(a,value_length);
    p = archive_entry_perm(entry);
    archive_entry_set_perm(entry,p);
    if (wVar1 == L'\0') {
      return L'\0';
    }
    if (wVar1 != L'\xffffffe2') {
      archive_set_error(&a->archive,-1,"%s %s","Parse error: ",pcVar3);
      return wVar1;
    }
    archive_set_error(&a->archive,0xc,"%s %s","Can\'t allocate memory for ",pcVar3);
  }
  return L'\xffffffe2';
}

Assistant:

static int
pax_attribute_SCHILY_acl(struct archive_read *a, struct tar *tar,
	struct archive_entry *entry, size_t value_length, int type)
{
	int r;
	const char *p;
	const char* errstr;

	switch (type) {
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
		errstr = "SCHILY.acl.access";
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		errstr = "SCHILY.acl.default";
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		errstr = "SCHILY.acl.ace";
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Unknown ACL type: %d", type);
		return(ARCHIVE_FATAL);
	}

	if (tar->sconv_acl == NULL) {
		tar->sconv_acl =
		    archive_string_conversion_from_charset(
			&(a->archive), "UTF-8", 1);
		if (tar->sconv_acl == NULL)
			return (ARCHIVE_FATAL);
	}

	if (value_length > acl_limit) {
		__archive_read_consume(a, value_length);
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
				  "Unreasonably large ACL: %d > %d",
				  (int)value_length, (int)acl_limit);
		return (ARCHIVE_WARN);
	}

	p = __archive_read_ahead(a, value_length, NULL);
	if (p == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "Truncated tar archive "
				  "detected while reading ACL data");
		return (ARCHIVE_FATAL);
	}

	r = archive_acl_from_text_nl(archive_entry_acl(entry), p, value_length,
	    type, tar->sconv_acl);
	__archive_read_consume(a, value_length);
	/* Workaround: Force perm_is_set() to be correct */
	/* If this bit were stored in the ACL, this wouldn't be needed */
	archive_entry_set_perm(entry, archive_entry_perm(entry));
	if (r != ARCHIVE_OK) {
		if (r == ARCHIVE_FATAL) {
			archive_set_error(&a->archive, ENOMEM,
			    "%s %s", "Can't allocate memory for ",
			    errstr);
			return (r);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC, "%s %s", "Parse error: ", errstr);
	}
	return (r);
}